

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*in_RCX) [64];
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  undefined1 auVar2 [64];
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00001a60;
  int in_stack_00001a6c;
  Mat *in_stack_00001a70;
  Mat *in_stack_00001a78;
  Mat *in_stack_00001a80;
  Mat *in_stack_00001a88;
  Mat *in_stack_00003810;
  int in_stack_0000381c;
  Mat *in_stack_00003820;
  Mat *in_stack_00003828;
  Mat *in_stack_00003830;
  Mat *in_stack_00003838;
  Option *in_stack_fffffffffffffe10;
  void **ppvVar3;
  Allocator *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 auStack_148 [48];
  void *local_118;
  int *local_110;
  long *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_c0;
  int local_bc;
  undefined1 (*local_b8) [64];
  long *local_b0;
  int local_94;
  void **local_90;
  int local_70;
  undefined4 local_6c;
  void **local_68;
  long *local_60;
  void **local_58;
  long *local_50;
  void **local_40;
  void *local_38;
  long *local_28;
  void **local_20;
  long *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_bc = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_b0 = in_RDX;
  if (((int)in_RSI[5] == 2) && (*(int *)((long)in_RSI + 0x2c) == local_bc)) {
    local_c0 = (undefined4)in_RSI[6];
    local_c8 = in_RSI[2];
    local_cc = (undefined4)in_RSI[3];
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    local_50 = local_b0;
    bVar1 = true;
    if (*local_b0 != 0) {
      local_28 = local_b0;
      bVar1 = local_b0[8] * (long)(int)local_b0[7] == 0;
    }
    if (!bVar1) {
      innerproduct_gemm_fp16s_sse
                (in_stack_00003838,in_stack_00003830,in_stack_00003828,in_stack_00003820,
                 in_stack_0000381c,in_stack_00003810,in_stack_fffffffffffffe10);
      return 0;
    }
    return -100;
  }
  local_40 = &local_118;
  local_118 = (void *)*in_RSI;
  local_110 = (int *)in_RSI[1];
  local_f8 = (long *)in_RSI[4];
  local_f0 = (undefined4)in_RSI[5];
  local_ec = *(undefined4 *)((long)in_RSI + 0x2c);
  local_e8 = (undefined4)in_RSI[6];
  local_e4 = *(undefined4 *)((long)in_RSI + 0x34);
  local_e0 = (int)in_RSI[7];
  local_d8 = in_RSI[8];
  if (local_110 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_110;
    *local_110 = *local_110 + 1;
    UNLOCK();
  }
  local_b8 = in_RCX;
  local_8 = local_40;
  if ((int)in_RSI[5] != 1) {
    auVar2 = vmovdqu64_avx512f(*in_RCX);
    auVar2 = vmovdqu64_avx512f(auVar2);
    auStack_148 = auVar2._16_48_;
    local_158 = auVar2._0_8_;
    uStack_150 = *(undefined8 *)(*in_RCX + 0x10);
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x38))
              (*(long **)(in_RDI + 0x250),in_RSI,&local_118,&local_158);
    local_58 = &local_118;
    if (local_118 != (void *)0x0) {
      local_20 = local_58;
    }
    if (local_118 == (void *)0x0 || local_d8 * local_e0 == 0) {
      local_94 = -100;
      goto LAB_00b012cb;
    }
    in_stack_fffffffffffffe47 = 0;
  }
  if (((*local_b8)[0x27] & 1) != 0) {
    if (*(int *)(in_RDI + 0xd0) % 0x10 == 0) {
      in_stack_fffffffffffffe34 = 0x10;
    }
    else if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
      in_stack_fffffffffffffe30 = 8;
      in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
    }
    else {
      in_stack_fffffffffffffe30 = 1;
      in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
      if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
        in_stack_fffffffffffffe30 = 4;
        in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
      }
    }
  }
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe3c,
              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
              in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
  local_60 = local_b0;
  bVar1 = true;
  if (*local_b0 != 0) {
    local_18 = local_b0;
    bVar1 = local_b0[8] * (long)(int)local_b0[7] == 0;
  }
  if (bVar1) {
    local_94 = -100;
  }
  else {
    innerproduct_fp16s_sse
              (in_stack_00001a88,in_stack_00001a80,in_stack_00001a78,in_stack_00001a70,
               in_stack_00001a6c,in_stack_00001a60,in_stack_fffffffffffffe10);
    local_94 = 0;
  }
LAB_00b012cb:
  ppvVar3 = &local_118;
  if (local_110 != (int *)0x0) {
    local_6c = 0xffffffff;
    LOCK();
    local_70 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (local_70 == 1) {
      local_90 = ppvVar3;
      local_68 = ppvVar3;
      if (local_f8 == (long *)0x0) {
        local_38 = local_118;
        if (local_118 != (void *)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_94;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}